

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlCharEncodingHandlerPtr xmlGetCharEncodingHandler(xmlCharEncoding enc)

{
  xmlCharEncodingHandlerPtr pxVar1;
  xmlCharEncodingHandlerPtr handler;
  xmlCharEncodingHandlerPtr pxStack_10;
  xmlCharEncoding enc_local;
  
  if (handlers == (xmlCharEncodingHandlerPtr *)0x0) {
    xmlInitCharEncodingHandlers();
  }
  switch(enc) {
  case XML_CHAR_ENCODING_NONE:
    return (xmlCharEncodingHandlerPtr)0x0;
  case XML_CHAR_ENCODING_UTF8:
    return (xmlCharEncodingHandlerPtr)0x0;
  case XML_CHAR_ENCODING_UTF16LE:
    return xmlUTF16LEHandler;
  case XML_CHAR_ENCODING_UTF16BE:
    return xmlUTF16BEHandler;
  case XML_CHAR_ENCODING_UCS4LE:
    pxVar1 = xmlFindCharEncodingHandler("ISO-10646-UCS-4");
    if (pxVar1 != (xmlCharEncodingHandlerPtr)0x0) {
      return pxVar1;
    }
    pxVar1 = xmlFindCharEncodingHandler("UCS-4");
    if (pxVar1 != (xmlCharEncodingHandlerPtr)0x0) {
      return pxVar1;
    }
    pxStack_10 = xmlFindCharEncodingHandler("UCS4");
    break;
  case XML_CHAR_ENCODING_UCS4BE:
    pxVar1 = xmlFindCharEncodingHandler("ISO-10646-UCS-4");
    if (pxVar1 != (xmlCharEncodingHandlerPtr)0x0) {
      return pxVar1;
    }
    pxVar1 = xmlFindCharEncodingHandler("UCS-4");
    if (pxVar1 != (xmlCharEncodingHandlerPtr)0x0) {
      return pxVar1;
    }
    pxStack_10 = xmlFindCharEncodingHandler("UCS4");
    break;
  case XML_CHAR_ENCODING_EBCDIC:
    pxVar1 = xmlFindCharEncodingHandler("EBCDIC");
    if (pxVar1 != (xmlCharEncodingHandlerPtr)0x0) {
      return pxVar1;
    }
    pxVar1 = xmlFindCharEncodingHandler("ebcdic");
    if (pxVar1 != (xmlCharEncodingHandlerPtr)0x0) {
      return pxVar1;
    }
    pxVar1 = xmlFindCharEncodingHandler("EBCDIC-US");
    if (pxVar1 != (xmlCharEncodingHandlerPtr)0x0) {
      return pxVar1;
    }
    pxStack_10 = xmlFindCharEncodingHandler("IBM-037");
    break;
  case XML_CHAR_ENCODING_UCS4_2143:
    goto switchD_00150510_default;
  case XML_CHAR_ENCODING_UCS4_3412:
    goto switchD_00150510_default;
  case XML_CHAR_ENCODING_UCS2:
    pxVar1 = xmlFindCharEncodingHandler("ISO-10646-UCS-2");
    if (pxVar1 != (xmlCharEncodingHandlerPtr)0x0) {
      return pxVar1;
    }
    pxVar1 = xmlFindCharEncodingHandler("UCS-2");
    if (pxVar1 != (xmlCharEncodingHandlerPtr)0x0) {
      return pxVar1;
    }
    pxStack_10 = xmlFindCharEncodingHandler("UCS2");
    break;
  case XML_CHAR_ENCODING_8859_1:
    pxStack_10 = xmlFindCharEncodingHandler("ISO-8859-1");
    break;
  case XML_CHAR_ENCODING_8859_2:
    pxStack_10 = xmlFindCharEncodingHandler("ISO-8859-2");
    break;
  case XML_CHAR_ENCODING_8859_3:
    pxStack_10 = xmlFindCharEncodingHandler("ISO-8859-3");
    break;
  case XML_CHAR_ENCODING_8859_4:
    pxStack_10 = xmlFindCharEncodingHandler("ISO-8859-4");
    break;
  case XML_CHAR_ENCODING_8859_5:
    pxStack_10 = xmlFindCharEncodingHandler("ISO-8859-5");
    break;
  case XML_CHAR_ENCODING_8859_6:
    pxStack_10 = xmlFindCharEncodingHandler("ISO-8859-6");
    break;
  case XML_CHAR_ENCODING_8859_7:
    pxStack_10 = xmlFindCharEncodingHandler("ISO-8859-7");
    break;
  case XML_CHAR_ENCODING_8859_8:
    pxStack_10 = xmlFindCharEncodingHandler("ISO-8859-8");
    break;
  case XML_CHAR_ENCODING_8859_9:
    pxStack_10 = xmlFindCharEncodingHandler("ISO-8859-9");
    break;
  case XML_CHAR_ENCODING_2022_JP:
    pxStack_10 = xmlFindCharEncodingHandler("ISO-2022-JP");
    break;
  case XML_CHAR_ENCODING_SHIFT_JIS:
    pxVar1 = xmlFindCharEncodingHandler("SHIFT-JIS");
    if (pxVar1 != (xmlCharEncodingHandlerPtr)0x0) {
      return pxVar1;
    }
    pxVar1 = xmlFindCharEncodingHandler("SHIFT_JIS");
    if (pxVar1 != (xmlCharEncodingHandlerPtr)0x0) {
      return pxVar1;
    }
    pxStack_10 = xmlFindCharEncodingHandler("Shift_JIS");
    break;
  case XML_CHAR_ENCODING_EUC_JP:
    pxStack_10 = xmlFindCharEncodingHandler("EUC-JP");
    break;
  case XML_CHAR_ENCODING_ERROR:
    return (xmlCharEncodingHandlerPtr)0x0;
  default:
    goto switchD_00150510_default;
  }
  if (pxStack_10 == (xmlCharEncodingHandlerPtr)0x0) {
switchD_00150510_default:
    pxStack_10 = (xmlCharEncodingHandlerPtr)0x0;
  }
  return pxStack_10;
}

Assistant:

xmlCharEncodingHandlerPtr
xmlGetCharEncodingHandler(xmlCharEncoding enc) {
    xmlCharEncodingHandlerPtr handler;

    if (handlers == NULL) xmlInitCharEncodingHandlers();
    switch (enc) {
        case XML_CHAR_ENCODING_ERROR:
	    return(NULL);
        case XML_CHAR_ENCODING_NONE:
	    return(NULL);
        case XML_CHAR_ENCODING_UTF8:
	    return(NULL);
        case XML_CHAR_ENCODING_UTF16LE:
	    return(xmlUTF16LEHandler);
        case XML_CHAR_ENCODING_UTF16BE:
	    return(xmlUTF16BEHandler);
        case XML_CHAR_ENCODING_EBCDIC:
            handler = xmlFindCharEncodingHandler("EBCDIC");
            if (handler != NULL) return(handler);
            handler = xmlFindCharEncodingHandler("ebcdic");
            if (handler != NULL) return(handler);
            handler = xmlFindCharEncodingHandler("EBCDIC-US");
            if (handler != NULL) return(handler);
            handler = xmlFindCharEncodingHandler("IBM-037");
            if (handler != NULL) return(handler);
	    break;
        case XML_CHAR_ENCODING_UCS4BE:
            handler = xmlFindCharEncodingHandler("ISO-10646-UCS-4");
            if (handler != NULL) return(handler);
            handler = xmlFindCharEncodingHandler("UCS-4");
            if (handler != NULL) return(handler);
            handler = xmlFindCharEncodingHandler("UCS4");
            if (handler != NULL) return(handler);
	    break;
        case XML_CHAR_ENCODING_UCS4LE:
            handler = xmlFindCharEncodingHandler("ISO-10646-UCS-4");
            if (handler != NULL) return(handler);
            handler = xmlFindCharEncodingHandler("UCS-4");
            if (handler != NULL) return(handler);
            handler = xmlFindCharEncodingHandler("UCS4");
            if (handler != NULL) return(handler);
	    break;
        case XML_CHAR_ENCODING_UCS4_2143:
	    break;
        case XML_CHAR_ENCODING_UCS4_3412:
	    break;
        case XML_CHAR_ENCODING_UCS2:
            handler = xmlFindCharEncodingHandler("ISO-10646-UCS-2");
            if (handler != NULL) return(handler);
            handler = xmlFindCharEncodingHandler("UCS-2");
            if (handler != NULL) return(handler);
            handler = xmlFindCharEncodingHandler("UCS2");
            if (handler != NULL) return(handler);
	    break;

	    /*
	     * We used to keep ISO Latin encodings native in the
	     * generated data. This led to so many problems that
	     * this has been removed. One can still change this
	     * back by registering no-ops encoders for those
	     */
        case XML_CHAR_ENCODING_8859_1:
	    handler = xmlFindCharEncodingHandler("ISO-8859-1");
	    if (handler != NULL) return(handler);
	    break;
        case XML_CHAR_ENCODING_8859_2:
	    handler = xmlFindCharEncodingHandler("ISO-8859-2");
	    if (handler != NULL) return(handler);
	    break;
        case XML_CHAR_ENCODING_8859_3:
	    handler = xmlFindCharEncodingHandler("ISO-8859-3");
	    if (handler != NULL) return(handler);
	    break;
        case XML_CHAR_ENCODING_8859_4:
	    handler = xmlFindCharEncodingHandler("ISO-8859-4");
	    if (handler != NULL) return(handler);
	    break;
        case XML_CHAR_ENCODING_8859_5:
	    handler = xmlFindCharEncodingHandler("ISO-8859-5");
	    if (handler != NULL) return(handler);
	    break;
        case XML_CHAR_ENCODING_8859_6:
	    handler = xmlFindCharEncodingHandler("ISO-8859-6");
	    if (handler != NULL) return(handler);
	    break;
        case XML_CHAR_ENCODING_8859_7:
	    handler = xmlFindCharEncodingHandler("ISO-8859-7");
	    if (handler != NULL) return(handler);
	    break;
        case XML_CHAR_ENCODING_8859_8:
	    handler = xmlFindCharEncodingHandler("ISO-8859-8");
	    if (handler != NULL) return(handler);
	    break;
        case XML_CHAR_ENCODING_8859_9:
	    handler = xmlFindCharEncodingHandler("ISO-8859-9");
	    if (handler != NULL) return(handler);
	    break;


        case XML_CHAR_ENCODING_2022_JP:
            handler = xmlFindCharEncodingHandler("ISO-2022-JP");
            if (handler != NULL) return(handler);
	    break;
        case XML_CHAR_ENCODING_SHIFT_JIS:
            handler = xmlFindCharEncodingHandler("SHIFT-JIS");
            if (handler != NULL) return(handler);
            handler = xmlFindCharEncodingHandler("SHIFT_JIS");
            if (handler != NULL) return(handler);
            handler = xmlFindCharEncodingHandler("Shift_JIS");
            if (handler != NULL) return(handler);
	    break;
        case XML_CHAR_ENCODING_EUC_JP:
            handler = xmlFindCharEncodingHandler("EUC-JP");
            if (handler != NULL) return(handler);
	    break;
	default:
	    break;
    }

#ifdef DEBUG_ENCODING
    xmlGenericError(xmlGenericErrorContext,
	    "No handler found for encoding %d\n", enc);
#endif
    return(NULL);
}